

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O1

void __thiscall chrono::viper::Viper::Create(Viper *this,ViperWheelType wheel_type)

{
  shared_ptr<chrono::ChMaterialSurface> *__args_2;
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Viper *pVVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _func_int **pp_Var6;
  double dVar7;
  double dVar8;
  ViperLowerArm *pVVar9;
  double *pdVar10;
  long lVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  long lVar13;
  ChVector<double> cr_rel_pos_lower [4];
  ChVector<double> sr_rel_pos [4];
  ChVector<double> cr_rel_pos_upper [4];
  uint local_218;
  undefined1 local_211;
  Viper *local_210;
  undefined8 local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  shared_ptr<chrono::ChMaterialSurface> *local_1f8;
  ViperWheelType local_1ec;
  ChFrame<double> local_1e8;
  double dStack_160;
  ChQuaternion<double> local_158;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  ViperLowerArm *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  double adStack_e8 [10];
  double local_98 [13];
  
  local_1f8 = &this->m_default_material;
  local_1e8._vptr_ChFrame = (_func_int **)0x0;
  local_1ec = wheel_type;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::viper::ViperChassis,std::allocator<chrono::viper::ViperChassis>,char_const(&)[8],std::shared_ptr<chrono::ChMaterialSurface>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e8.coord,
             (ViperChassis **)&local_1e8,(allocator<chrono::viper::ViperChassis> *)&local_158,
             (char (*) [8])0x16a4c4,local_1f8);
  dVar7 = local_1e8.coord.pos.m_data[0];
  pp_Var6 = local_1e8._vptr_ChFrame;
  local_1e8._vptr_ChFrame = (_func_int **)0x0;
  local_1e8.coord.pos.m_data[0] = 0.0;
  p_Var2 = (this->m_chassis).
           super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_chassis).super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pp_Var6;
  (this->m_chassis).super___shared_ptr<chrono::viper::ViperChassis,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar7;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8.coord.pos.m_data[0] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8.coord.pos.m_data[0]);
  }
  local_1e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_1e8.coord.pos.m_data[0] = 0.6417999999999999;
  local_1e8.coord.pos.m_data[1] = 0.6097999999999999;
  local_1e8.coord.pos.m_data[2] = 0.0;
  local_1e8.coord.rot.m_data[0] = QUNIT;
  local_1e8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_1e8.coord.rot.m_data[2] = _ChBody;
  local_1e8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_1e8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  __args_2 = &this->m_wheel_material;
  local_158.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::viper::ViperWheel,std::allocator<chrono::viper::ViperWheel>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158.m_data + 1),
             (ViperWheel **)&local_158,(allocator<chrono::viper::ViperWheel> *)local_98,
             (char (*) [9])"wheel_LF",&local_1e8,__args_2,&local_1ec);
  dVar8 = local_158.m_data[1];
  dVar7 = local_158.m_data[0];
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  p_Var2 = (this->m_wheels)._M_elems[0].
           super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_wheels)._M_elems[0].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar7;
  (this->m_wheels)._M_elems[0].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar8;
  local_210 = this;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1]);
  }
  local_1e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_1e8.coord.pos.m_data[0] = 0.6417999999999999;
  local_1e8.coord.pos.m_data[1] = -0.6097999999999999;
  local_1e8.coord.pos.m_data[2] = 0.0;
  local_1e8.coord.rot.m_data[0] = QUNIT;
  local_1e8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_1e8.coord.rot.m_data[2] = _ChBody;
  local_1e8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_1e8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_158.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::viper::ViperWheel,std::allocator<chrono::viper::ViperWheel>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158.m_data + 1),
             (ViperWheel **)&local_158,(allocator<chrono::viper::ViperWheel> *)local_98,
             (char (*) [9])"wheel_RF",&local_1e8,__args_2,&local_1ec);
  dVar8 = local_158.m_data[1];
  dVar7 = local_158.m_data[0];
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  p_Var2 = (local_210->m_wheels)._M_elems[1].
           super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (local_210->m_wheels)._M_elems[1].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar7;
  (local_210->m_wheels)._M_elems[1].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar8;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1]);
  }
  local_1e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_1e8.coord.pos.m_data[0] = -0.6417999999999999;
  local_1e8.coord.pos.m_data[1] = 0.6097999999999999;
  local_1e8.coord.pos.m_data[2] = 0.0;
  local_1e8.coord.rot.m_data[0] = QUNIT;
  local_1e8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_1e8.coord.rot.m_data[2] = _ChBody;
  local_1e8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_1e8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_158.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::viper::ViperWheel,std::allocator<chrono::viper::ViperWheel>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158.m_data + 1),
             (ViperWheel **)&local_158,(allocator<chrono::viper::ViperWheel> *)local_98,
             (char (*) [9])"wheel_LB",&local_1e8,__args_2,&local_1ec);
  dVar8 = local_158.m_data[1];
  dVar7 = local_158.m_data[0];
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  p_Var2 = (local_210->m_wheels)._M_elems[2].
           super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (local_210->m_wheels)._M_elems[2].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar7;
  (local_210->m_wheels)._M_elems[2].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar8;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1]);
  }
  local_1e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_1e8.coord.pos.m_data[0] = -0.6417999999999999;
  local_1e8.coord.pos.m_data[1] = -0.6097999999999999;
  local_1e8.coord.pos.m_data[2] = 0.0;
  local_1e8.coord.rot.m_data[0] = QUNIT;
  local_1e8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_1e8.coord.rot.m_data[2] = _ChBody;
  local_1e8.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_1e8.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_158.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::viper::ViperWheel,std::allocator<chrono::viper::ViperWheel>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::viper::ViperWheelType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158.m_data + 1),
             (ViperWheel **)&local_158,(allocator<chrono::viper::ViperWheel> *)local_98,
             (char (*) [9])"wheel_RB",&local_1e8,__args_2,&local_1ec);
  dVar8 = local_158.m_data[1];
  dVar7 = local_158.m_data[0];
  pVVar3 = local_210;
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  p_Var2 = (local_210->m_wheels)._M_elems[3].
           super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (local_210->m_wheels)._M_elems[3].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar7;
  (local_210->m_wheels)._M_elems[3].
  super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar8;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.m_data[1]);
  }
  chrono::Q_from_AngZ(3.141592653589793);
  local_1e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_1e8.coord.pos.m_data[0] = VNULL;
  local_1e8.coord.pos.m_data[1] = _put;
  local_1e8.coord.pos.m_data[2] = _UpdateForces;
  local_1e8.coord.rot.m_data[0] = local_158.m_data[0];
  local_1e8.coord.rot.m_data[1] = local_158.m_data[1];
  local_1e8.coord.rot.m_data[2] = local_158.m_data[2];
  local_1e8.coord.rot.m_data[3] = local_158.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_1e8.Amatrix,&local_158);
  ChFrame<double>::operator=
            (&(((pVVar3->m_wheels)._M_elems[0].
                super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ViperPart).m_mesh_xform,&local_1e8);
  chrono::Q_from_AngZ(3.141592653589793);
  local_1e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_1e8.coord.pos.m_data[0] = VNULL;
  local_1e8.coord.pos.m_data[1] = _put;
  local_1e8.coord.pos.m_data[2] = _UpdateForces;
  local_1e8.coord.rot.m_data[0] = local_158.m_data[0];
  local_1e8.coord.rot.m_data[1] = local_158.m_data[1];
  local_1e8.coord.rot.m_data[2] = local_158.m_data[2];
  local_1e8.coord.rot.m_data[3] = local_158.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_1e8.Amatrix,&local_158);
  ChFrame<double>::operator=
            (&(((pVVar3->m_wheels)._M_elems[2].
                super___shared_ptr<chrono::viper::ViperWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ViperPart).m_mesh_xform,&local_1e8);
  local_158.m_data[0] = 0.6417999999999999;
  local_158.m_data[1] = 0.2067;
  local_158.m_data[2] = -0.0525;
  local_158.m_data[3] = 0.6417999999999999;
  uStack_138 = 0xbfca7525460aa64c;
  uStack_130 = 0xbfaae147ae147ae1;
  uStack_128 = 0xbfe489a027525460;
  uStack_120 = 0x3fca7525460aa64c;
  local_118 = 0xbfaae147ae147ae1;
  uStack_110 = 0xbfe489a027525460;
  uStack_108 = 0xbfca7525460aa64c;
  uStack_100 = 0xbfaae147ae147ae1;
  local_98[0] = 0.6417999999999999;
  local_98[1] = 0.2067;
  local_98[2] = 0.0525;
  local_98[3] = 0.6417999999999999;
  local_98[4] = -0.2067;
  local_98[5] = 0.0525;
  local_98[6] = -0.6417999999999999;
  local_98[7] = 0.2067;
  local_98[8] = 0.0525;
  local_98[9] = -0.6417999999999999;
  local_98[10] = -0.2067;
  local_98[0xb] = 0.0525;
  p_Var12 = &(pVVar3->m_lower_arms)._M_elems[0].
             super___shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  lVar11 = 0x10;
  lVar13 = 0;
  do {
    local_1e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
    local_1e8.coord.pos.m_data[0] =
         *(double *)
          ((long)&local_1e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
          lVar11 + 0x40);
    local_1e8.coord.pos.m_data[1] = *(double *)((long)&dStack_160 + lVar11);
    local_1e8.coord.pos.m_data[2] = *(double *)((long)local_158.m_data + lVar11);
    local_1e8.coord.rot.m_data[0] = QUNIT;
    local_1e8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
    local_1e8.coord.rot.m_data[2] = _ChBody;
    local_1e8.coord.rot.m_data[3] = _ComputeMassProperties;
    ChMatrix33<double>::ChMatrix33(&local_1e8.Amatrix,(ChQuaternion<double> *)&QUNIT);
    local_208 = (ViperUpright *)(CONCAT44(local_208._4_4_,(int)lVar13) & 0xffffffff00000001);
    local_f8 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::viper::ViperLowerArm,std::allocator<chrono::viper::ViperLowerArm>,char_const(&)[10],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
              (&_Stack_f0,&local_f8,(allocator<chrono::viper::ViperLowerArm> *)&local_218,
               (char (*) [10])"lower_arm",&local_1e8,local_1f8,(int *)&local_208);
    _Var5._M_pi = _Stack_f0._M_pi;
    pVVar9 = local_f8;
    local_f8 = (ViperLowerArm *)0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = p_Var12->_M_pi;
    ((__shared_ptr<chrono::viper::ViperLowerArm,_(__gnu_cxx::_Lock_policy)2> *)(p_Var12 + -1))->
    _M_ptr = pVVar9;
    p_Var12->_M_pi = _Var5._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (_Stack_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
    }
    local_1e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
    local_1e8.coord.pos.m_data[0] = *(double *)((long)adStack_e8 + lVar11 + 0x40);
    local_1e8.coord.pos.m_data[1] = *(double *)((long)adStack_e8 + lVar11 + 0x48);
    local_1e8.coord.pos.m_data[2] = *(double *)((long)local_98 + lVar11);
    local_1e8.coord.rot.m_data[0] = QUNIT;
    local_1e8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
    local_1e8.coord.rot.m_data[2] = _ChBody;
    local_1e8.coord.rot.m_data[3] = _ComputeMassProperties;
    ChMatrix33<double>::ChMatrix33(&local_1e8.Amatrix,(ChQuaternion<double> *)&QUNIT);
    local_208 = (ViperUpright *)(CONCAT44(local_208._4_4_,(int)lVar13) & 0xffffffff00000001);
    local_f8 = (ViperLowerArm *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::viper::ViperUpperArm,std::allocator<chrono::viper::ViperUpperArm>,char_const(&)[10],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
              (&_Stack_f0,(ViperUpperArm **)&local_f8,
               (allocator<chrono::viper::ViperUpperArm> *)&local_218,(char (*) [10])"upper_arm",
               &local_1e8,local_1f8,(int *)&local_208);
    _Var5._M_pi = _Stack_f0._M_pi;
    pVVar9 = local_f8;
    local_f8 = (ViperLowerArm *)0x0;
    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = p_Var12[-8]._M_pi;
    p_Var12[-9] = (__shared_count<(__gnu_cxx::_Lock_policy)2>)pVVar9;
    p_Var12[-8] = (__shared_count<(__gnu_cxx::_Lock_policy)2>)_Var5._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (_Stack_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
    }
    lVar13 = lVar13 + 1;
    lVar11 = lVar11 + 0x18;
    p_Var12 = p_Var12 + 2;
  } while (lVar13 != 4);
  pdVar10 = adStack_e8;
  local_f8 = (ViperLowerArm *)0x3fe489a027525460;
  _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fe3837b4a2339c0;
  adStack_e8[0] = -0.0;
  adStack_e8[1] = 0.6417999999999999;
  adStack_e8[2] = -0.6097999999999999;
  adStack_e8[3] = -0.0;
  adStack_e8[4] = -0.6417999999999999;
  adStack_e8[5] = 0.6097999999999999;
  adStack_e8[6] = -0.0;
  adStack_e8[7] = -0.6417999999999999;
  adStack_e8[8] = -0.6097999999999999;
  adStack_e8[9] = -0.0;
  p_Var12 = &(local_210->m_uprights)._M_elems[0].
             super___shared_ptr<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  lVar11 = 0;
  do {
    local_1e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
    local_1e8.coord.pos.m_data[0] = pdVar10[-2];
    local_1e8.coord.pos.m_data[1] = pdVar10[-1];
    local_1e8.coord.pos.m_data[2] = *pdVar10;
    local_1e8.coord.rot.m_data[0] = QUNIT;
    local_1e8.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
    local_1e8.coord.rot.m_data[2] = _ChBody;
    local_1e8.coord.rot.m_data[3] = _ComputeMassProperties;
    ChMatrix33<double>::ChMatrix33(&local_1e8.Amatrix,(ChQuaternion<double> *)&QUNIT);
    local_218 = (uint)lVar11 & 1;
    local_208 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::viper::ViperUpright,std::allocator<chrono::viper::ViperUpright>,char_const(&)[8],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
              (&_Stack_200,(ViperUpright **)&local_208,
               (allocator<chrono::viper::ViperUpright> *)&local_211,(char (*) [8])"upright",
               &local_1e8,local_1f8,(int *)&local_218);
    _Var5._M_pi = _Stack_200._M_pi;
    peVar4 = local_208;
    local_208 = (ViperUpright *)0x0;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = p_Var12->_M_pi;
    ((__shared_ptr<chrono::viper::ViperUpright,_(__gnu_cxx::_Lock_policy)2> *)(p_Var12 + -1))->
    _M_ptr = peVar4;
    p_Var12->_M_pi = _Var5._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
    }
    pVVar3 = local_210;
    lVar11 = lVar11 + 1;
    pdVar10 = pdVar10 + 3;
    p_Var12 = p_Var12 + 2;
  } while (lVar11 != 4);
  lVar11 = 0;
  do {
    local_1e8._vptr_ChFrame = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e8.coord,(ChShaft **)&local_1e8
               ,(allocator<chrono::ChShaft> *)&local_208);
    dVar7 = local_1e8.coord.pos.m_data[0];
    pp_Var6 = local_1e8._vptr_ChFrame;
    local_1e8._vptr_ChFrame = (_func_int **)0x0;
    local_1e8.coord.pos.m_data[0] = 0.0;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(pVVar3->m_drive_shafts)._M_elems[0].
                      super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi + lVar11);
    puVar1 = (undefined8 *)
             ((long)&(pVVar3->m_drive_shafts)._M_elems[0].
                     super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar11
             );
    *puVar1 = pp_Var6;
    puVar1[1] = dVar7;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8.coord.pos.m_data[0]);
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  return;
}

Assistant:

void Viper::Create(ViperWheelType wheel_type) {
    // create rover chassis
    m_chassis = chrono_types::make_shared<ViperChassis>("chassis", m_default_material);

    // initilize rover wheels
    double wx = 0.5618 + 0.08;
    double wy = 0.2067 + 0.32 + 0.0831;
    double wz = 0.0;

    m_wheels[V_LF] = chrono_types::make_shared<ViperWheel>("wheel_LF", ChFrame<>(ChVector<>(+wx, +wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_RF] = chrono_types::make_shared<ViperWheel>("wheel_RF", ChFrame<>(ChVector<>(+wx, -wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_LB] = chrono_types::make_shared<ViperWheel>("wheel_LB", ChFrame<>(ChVector<>(-wx, +wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);
    m_wheels[V_RB] = chrono_types::make_shared<ViperWheel>("wheel_RB", ChFrame<>(ChVector<>(-wx, -wy, wz), QUNIT),
                                                           m_wheel_material, wheel_type);

    m_wheels[V_LF]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[V_LB]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));

    // create rover upper and lower suspension arms
    double cr_lx = 0.5618 + 0.08;
    double cr_ly = 0.2067;  // + 0.32/2;
    double cr_lz = 0.0525;

    ChVector<> cr_rel_pos_lower[] = {
        ChVector<>(+cr_lx, +cr_ly, -cr_lz),  // LF
        ChVector<>(+cr_lx, -cr_ly, -cr_lz),  // RF
        ChVector<>(-cr_lx, +cr_ly, -cr_lz),  // LB
        ChVector<>(-cr_lx, -cr_ly, -cr_lz)   // RB
    };

    ChVector<> cr_rel_pos_upper[] = {
        ChVector<>(+cr_lx, +cr_ly, cr_lz),  // LF
        ChVector<>(+cr_lx, -cr_ly, cr_lz),  // RF
        ChVector<>(-cr_lx, +cr_ly, cr_lz),  // LB
        ChVector<>(-cr_lx, -cr_ly, cr_lz)   // RB
    };

    for (int i = 0; i < 4; i++) {
        m_lower_arms[i] = chrono_types::make_shared<ViperLowerArm>("lower_arm", ChFrame<>(cr_rel_pos_lower[i], QUNIT),
                                                                   m_default_material, i % 2);
        m_upper_arms[i] = chrono_types::make_shared<ViperUpperArm>("upper_arm", ChFrame<>(cr_rel_pos_upper[i], QUNIT),
                                                                   m_default_material, i % 2);
    }

    // create uprights
    double sr_lx = 0.5618 + 0.08;
    double sr_ly = 0.2067 + 0.32 + 0.0831;
    double sr_lz = 0.0;
    ChVector<> sr_rel_pos[] = {
        ChVector<>(+sr_lx, +sr_ly, -sr_lz),  // LF
        ChVector<>(+sr_lx, -sr_ly, -sr_lz),  // RF
        ChVector<>(-sr_lx, +sr_ly, -sr_lz),  // LB
        ChVector<>(-sr_lx, -sr_ly, -sr_lz)   // RB
    };

    for (int i = 0; i < 4; i++) {
        m_uprights[i] = chrono_types::make_shared<ViperUpright>("upright", ChFrame<>(sr_rel_pos[i], QUNIT),
                                                                m_default_material, i % 2);
    }

    // create drive shafts
    for (int i = 0; i < 4; i++) {
        m_drive_shafts[i] = chrono_types::make_shared<ChShaft>();
    }
}